

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_6::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  bool bVar1;
  Type TVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  FieldDescriptor *in_RDI;
  undefined8 in_R9;
  int fixed_size;
  string capitalized_type;
  JavaType javaType;
  undefined4 in_stack_ffffffffffffe678;
  int in_stack_ffffffffffffe67c;
  AlphaNum *in_stack_ffffffffffffe680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe688;
  string *psVar6;
  FieldDescriptor *in_stack_ffffffffffffe690;
  char *in_stack_ffffffffffffe6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe6a8;
  AlphaNum *in_stack_ffffffffffffe6b8;
  key_type *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe6c0;
  char *in_stack_ffffffffffffe6c8;
  int bitIndex;
  int iVar7;
  JavaType type;
  undefined8 in_stack_ffffffffffffe6d0;
  FieldDescriptor *in_stack_ffffffffffffe6d8;
  allocator *paVar8;
  undefined8 in_stack_ffffffffffffe700;
  undefined1 cap_next_letter;
  string *in_stack_ffffffffffffe708;
  undefined8 in_stack_ffffffffffffe778;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffe970;
  FieldGeneratorInfo *in_stack_ffffffffffffe978;
  undefined4 in_stack_ffffffffffffe980;
  undefined4 in_stack_ffffffffffffe984;
  allocator local_1229;
  string local_1228 [32];
  string local_1208 [39];
  undefined1 local_11e1 [33];
  string local_11c0 [39];
  allocator local_1199;
  string local_1198 [32];
  string local_1178 [39];
  allocator local_1151;
  string local_1150 [32];
  string local_1130 [39];
  allocator local_1109;
  string local_1108 [32];
  string local_10e8 [39];
  allocator local_10c1;
  string local_10c0 [32];
  string local_10a0 [39];
  allocator local_1079;
  string local_1078 [32];
  string local_1058 [39];
  allocator local_1031;
  string local_1030 [39];
  allocator local_1009;
  string local_1008 [39];
  allocator local_fe1;
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [39];
  allocator local_f79;
  string local_f78 [39];
  allocator local_f51;
  string local_f50 [32];
  string local_f30 [32];
  string local_f10 [39];
  allocator local_ee9;
  string local_ee8 [39];
  allocator local_ec1;
  string local_ec0 [39];
  allocator local_e99;
  string local_e98 [39];
  allocator local_e71;
  string local_e70 [32];
  string local_e50 [39];
  allocator local_e29;
  string local_e28 [32];
  string local_e08 [32];
  string local_de8 [39];
  allocator local_dc1;
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [39];
  allocator local_d59;
  string local_d58 [32];
  string local_d38 [32];
  string local_d18 [39];
  allocator local_cf1;
  string local_cf0 [32];
  string local_cd0 [39];
  allocator local_ca9;
  string local_ca8 [32];
  string local_c88 [39];
  allocator local_c61;
  string local_c60 [39];
  allocator local_c39;
  string local_c38 [80];
  string local_be8 [32];
  int local_bc8;
  allocator local_bc1;
  string local_bc0 [39];
  allocator local_b99;
  string local_b98 [39];
  allocator local_b71;
  string local_b70 [39];
  allocator local_b49;
  string local_b48 [80];
  string local_af8 [39];
  allocator local_ad1;
  string local_ad0 [80];
  string local_a80 [39];
  allocator local_a59;
  string local_a58 [39];
  allocator local_a31;
  string local_a30 [39];
  byte local_a09;
  string local_a08 [38];
  byte local_9e2;
  allocator local_9e1;
  string local_9e0 [39];
  allocator local_9b9;
  string local_9b8 [32];
  string local_998 [39];
  allocator local_971;
  string local_970 [39];
  allocator local_949;
  string local_948 [32];
  string local_928 [39];
  allocator local_901;
  string local_900 [39];
  allocator local_8d9;
  string local_8d8 [32];
  string local_8b8 [39];
  allocator local_891;
  string local_890 [39];
  allocator local_869;
  string local_868 [32];
  string local_848 [39];
  allocator local_821;
  string local_820 [39];
  allocator local_7f9;
  string local_7f8 [39];
  allocator local_7d1;
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [39];
  allocator local_749;
  string local_748 [39];
  allocator local_721;
  string local_720 [39];
  allocator local_6f9;
  string local_6f8 [39];
  allocator local_6d1;
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [39];
  allocator local_629;
  string local_628 [39];
  allocator local_601;
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [39];
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [32];
  string local_550 [32];
  string local_530 [39];
  allocator local_509;
  string local_508 [39];
  allocator local_4e1;
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [32];
  string local_430 [32];
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [32];
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [39];
  allocator local_259;
  string local_258 [32];
  string local_238 [32];
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [39];
  allocator local_189;
  string local_188 [32];
  string local_168 [32];
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [36];
  JavaType local_2c;
  int iStack_24;
  FieldDescriptor *local_8;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffe778 >> 0x20);
  iStack_24 = (int)((ulong)in_R9 >> 0x20);
  cap_next_letter = (undefined1)((ulong)in_stack_ffffffffffffe700 >> 0x38);
  local_8 = in_RDI;
  SetCommonFieldVariables
            ((FieldDescriptor *)CONCAT44(in_stack_ffffffffffffe984,in_stack_ffffffffffffe980),
             in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
  local_2c = GetJavaType(in_stack_ffffffffffffe6d8);
  pcVar3 = PrimitiveTypeName((JavaType)((ulong)in_stack_ffffffffffffe6d8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"type",&local_51);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pcVar3 = BoxedPrimitiveTypeName((JavaType)((ulong)in_stack_ffffffffffffe6d8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"boxed_type",&local_89);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"type",&local_b1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"field_type",&local_d9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)pmVar4);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  if ((((local_2c == JAVATYPE_BOOLEAN) || (local_2c == JAVATYPE_DOUBLE)) ||
      (local_2c == JAVATYPE_FLOAT)) || ((local_2c == JAVATYPE_INT || (local_2c == JAVATYPE_LONG))))
  {
    pcVar3 = PrimitiveTypeName((JavaType)((ulong)in_stack_ffffffffffffe6d8 >> 0x20));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,pcVar3,&local_121);
    UnderscoresToCamelCase(in_stack_ffffffffffffe708,(bool)cap_next_letter);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::operator+(in_stack_ffffffffffffe6c8,in_stack_ffffffffffffe6c0);
    std::operator+(in_stack_ffffffffffffe688,(char *)in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"field_list_type",&local_189);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_148);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_168);
    std::operator+(in_stack_ffffffffffffe6c8,in_stack_ffffffffffffe6c0);
    std::operator+(in_stack_ffffffffffffe688,(char *)in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,"empty_list",&local_1f1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_1b0);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::string::~string(local_1d0);
    std::operator+(in_stack_ffffffffffffe6c8,in_stack_ffffffffffffe6c0);
    std::operator+(in_stack_ffffffffffffe688,(char *)in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_258,"create_list",&local_259);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_218);
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"name",&local_2c1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe6c8,in_stack_ffffffffffffe6c0);
    std::operator+(in_stack_ffffffffffffe688,(char *)in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e8,"mutable_copy_list",&local_2e9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_280);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::string::~string(local_2a0);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"name",&local_331);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe6a8,in_stack_ffffffffffffe6a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_358,"name_make_immutable",&local_359);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_310);
    std::__cxx11::string::~string(local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
    std::__cxx11::string::~string(local_310);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c0,"name",&local_3c1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe6a8,in_stack_ffffffffffffe6a0);
    std::operator+(in_stack_ffffffffffffe688,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e8,"repeated_get",&local_3e9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_380);
    std::__cxx11::string::~string(local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    std::__cxx11::string::~string(local_380);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::string::~string(local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_450,"name",&local_451);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe6a8,in_stack_ffffffffffffe6a0);
    std::operator+(in_stack_ffffffffffffe688,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_478,"repeated_add",&local_479);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_410);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    std::__cxx11::string::~string(local_410);
    std::__cxx11::string::~string(local_430);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e0,"name",&local_4e1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe6a8,in_stack_ffffffffffffe6a0);
    std::operator+(in_stack_ffffffffffffe688,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_508,"repeated_set",&local_509);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_4a0);
    std::__cxx11::string::~string(local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
    std::__cxx11::string::~string(local_4a0);
    std::__cxx11::string::~string(local_4c0);
    std::__cxx11::string::~string(local_4e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    std::__cxx11::string::~string(local_100);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_570,"boxed_type",&local_571);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe6c8,in_stack_ffffffffffffe6c0);
    std::operator+(in_stack_ffffffffffffe688,(char *)in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_598,"field_list_type",&local_599);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_530);
    std::__cxx11::string::~string(local_598);
    std::allocator<char>::~allocator((allocator<char> *)&local_599);
    std::__cxx11::string::~string(local_530);
    std::__cxx11::string::~string(local_550);
    std::__cxx11::string::~string(local_570);
    std::allocator<char>::~allocator((allocator<char> *)&local_571);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_600,"boxed_type",&local_601);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe6c8,in_stack_ffffffffffffe6c0);
    std::operator+(in_stack_ffffffffffffe688,(char *)in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_628,"create_list",&local_629);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_5c0);
    std::__cxx11::string::~string(local_628);
    std::allocator<char>::~allocator((allocator<char> *)&local_629);
    std::__cxx11::string::~string(local_5c0);
    std::__cxx11::string::~string(local_5e0);
    std::__cxx11::string::~string(local_600);
    std::allocator<char>::~allocator((allocator<char> *)&local_601);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6d0,"boxed_type",&local_6d1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe6c8,in_stack_ffffffffffffe6c0);
    std::operator+(in_stack_ffffffffffffe688,(char *)in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6f8,"name",&local_6f9);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe688,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe680);
    std::operator+(in_stack_ffffffffffffe688,(char *)in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_720,"mutable_copy_list",&local_721);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_650);
    std::__cxx11::string::~string(local_720);
    std::allocator<char>::~allocator((allocator<char> *)&local_721);
    std::__cxx11::string::~string(local_650);
    std::__cxx11::string::~string(local_670);
    std::__cxx11::string::~string(local_6f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
    std::__cxx11::string::~string(local_690);
    std::__cxx11::string::~string(local_6b0);
    std::__cxx11::string::~string(local_6d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_748,"empty_list",&local_749);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,"java.util.Collections.emptyList()");
    std::__cxx11::string::~string(local_748);
    std::allocator<char>::~allocator((allocator<char> *)&local_749);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7d0,"name",&local_7d1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe6a8,in_stack_ffffffffffffe6a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7f8,"name",&local_7f9);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe688,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe680);
    std::operator+(in_stack_ffffffffffffe688,(char *)in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_820,"name_make_immutable",&local_821);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_770);
    std::__cxx11::string::~string(local_820);
    std::allocator<char>::~allocator((allocator<char> *)&local_821);
    std::__cxx11::string::~string(local_770);
    std::__cxx11::string::~string(local_790);
    std::__cxx11::string::~string(local_7f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
    std::__cxx11::string::~string(local_7b0);
    std::__cxx11::string::~string(local_7d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_868,"name",&local_869);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe6a8,in_stack_ffffffffffffe6a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_890,"repeated_get",&local_891);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_848);
    std::__cxx11::string::~string(local_890);
    std::allocator<char>::~allocator((allocator<char> *)&local_891);
    std::__cxx11::string::~string(local_848);
    std::__cxx11::string::~string(local_868);
    std::allocator<char>::~allocator((allocator<char> *)&local_869);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8d8,"name",&local_8d9);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe6a8,in_stack_ffffffffffffe6a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_900,"repeated_add",&local_901);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_8b8);
    std::__cxx11::string::~string(local_900);
    std::allocator<char>::~allocator((allocator<char> *)&local_901);
    std::__cxx11::string::~string(local_8b8);
    std::__cxx11::string::~string(local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_948,"name",&local_949);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::operator+(in_stack_ffffffffffffe6a8,in_stack_ffffffffffffe6a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_970,"repeated_set",&local_971);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_928);
    std::__cxx11::string::~string(local_970);
    std::allocator<char>::~allocator((allocator<char> *)&local_971);
    std::__cxx11::string::~string(local_928);
    std::__cxx11::string::~string(local_948);
    std::allocator<char>::~allocator((allocator<char> *)&local_949);
  }
  ImmutableDefaultValue_abi_cxx11_
            ((FieldDescriptor *)in_stack_ffffffffffffe688,
             (ClassNameResolver *)in_stack_ffffffffffffe680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9b8,"default",&local_9b9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  std::__cxx11::string::operator=((string *)pmVar4,local_998);
  std::__cxx11::string::~string(local_9b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
  std::__cxx11::string::~string(local_998);
  bVar1 = IsDefaultValueJavaDefault(in_stack_ffffffffffffe6d8);
  local_9e2 = 0;
  local_a09 = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_9e2 = 1;
    std::__cxx11::string::string(local_9e0,"",&local_9e1);
  }
  else {
    ImmutableDefaultValue_abi_cxx11_
              ((FieldDescriptor *)in_stack_ffffffffffffe688,
               (ClassNameResolver *)in_stack_ffffffffffffe680);
    local_a09 = 1;
    std::operator+((char *)in_stack_ffffffffffffe688,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe680);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a30,"default_init",&local_a31);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  std::__cxx11::string::operator=((string *)pmVar4,local_9e0);
  std::__cxx11::string::~string(local_a30);
  std::allocator<char>::~allocator((allocator<char> *)&local_a31);
  std::__cxx11::string::~string(local_9e0);
  if ((local_a09 & 1) != 0) {
    std::__cxx11::string::~string(local_a08);
  }
  if ((local_9e2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
  }
  pcVar3 = GetCapitalizedType(in_stack_ffffffffffffe6d8,
                              SUB81((ulong)in_stack_ffffffffffffe6d0 >> 0x38,0));
  type = (JavaType)in_stack_ffffffffffffe6d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a58,"capitalized_type",&local_a59);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string(local_a58);
  std::allocator<char>::~allocator((allocator<char> *)&local_a59);
  internal::WireFormat::MakeTag((FieldDescriptor *)in_stack_ffffffffffffe680);
  strings::AlphaNum::AlphaNum(in_stack_ffffffffffffe680,in_stack_ffffffffffffe67c);
  StrCat_abi_cxx11_(in_stack_ffffffffffffe6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ad0,"tag",&local_ad1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  psVar6 = local_a80;
  std::__cxx11::string::operator=((string *)pmVar4,psVar6);
  std::__cxx11::string::~string(local_ad0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad1);
  std::__cxx11::string::~string(psVar6);
  FieldDescriptor::number(local_8);
  GetType((FieldDescriptor *)0x59525e);
  internal::WireFormat::TagSize
            ((int)((ulong)in_stack_ffffffffffffe680 >> 0x20),(Type)in_stack_ffffffffffffe680);
  strings::AlphaNum::AlphaNum
            (in_stack_ffffffffffffe680,CONCAT44(in_stack_ffffffffffffe67c,in_stack_ffffffffffffe678)
            );
  StrCat_abi_cxx11_(in_stack_ffffffffffffe6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b48,"tag_size",&local_b49);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  std::__cxx11::string::operator=((string *)pmVar4,local_af8);
  std::__cxx11::string::~string(local_b48);
  std::allocator<char>::~allocator((allocator<char> *)&local_b49);
  std::__cxx11::string::~string(local_af8);
  GetJavaType(in_stack_ffffffffffffe6d8);
  bVar1 = IsReferenceType(type);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b70,"null_check",&local_b71);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=
              ((string *)pmVar4,
               "  if (value == null) {\n    throw new NullPointerException();\n  }\n");
    std::__cxx11::string::~string(local_b70);
    std::allocator<char>::~allocator((allocator<char> *)&local_b71);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b98,"null_check",&local_b99);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,"");
    std::__cxx11::string::~string(local_b98);
    std::allocator<char>::~allocator((allocator<char> *)&local_b99);
  }
  FieldDescriptor::options(local_8);
  bVar1 = FieldOptions::deprecated((FieldOptions *)0x59572a);
  pcVar3 = "";
  if (bVar1) {
    pcVar3 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc0,"deprecation",&local_bc1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string(local_bc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
  GetType((FieldDescriptor *)0x5957e8);
  local_bc8 = FixedSize(type);
  if (local_bc8 != -1) {
    strings::AlphaNum::AlphaNum(in_stack_ffffffffffffe680,in_stack_ffffffffffffe67c);
    StrCat_abi_cxx11_(in_stack_ffffffffffffe6b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c38,"fixed_size",&local_c39);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_be8);
    std::__cxx11::string::~string(local_c38);
    std::allocator<char>::~allocator((allocator<char> *)&local_c39);
    std::__cxx11::string::~string(local_be8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c60,"on_changed",&local_c61);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  std::__cxx11::string::operator=((string *)pmVar4,"onChanged();");
  std::__cxx11::string::~string(local_c60);
  std::allocator<char>::~allocator((allocator<char> *)&local_c61);
  FieldDescriptor::file(local_8);
  bVar1 = SupportFieldPresence((FileDescriptor *)0x595a1e);
  if (bVar1) {
    GenerateGetBit_abi_cxx11_((int)((ulong)in_stack_ffffffffffffe6c8 >> 0x20));
    bitIndex = (int)((ulong)in_stack_ffffffffffffe6c8 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ca8,"get_has_field_bit_message",&local_ca9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_c88);
    std::__cxx11::string::~string(local_ca8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
    std::__cxx11::string::~string(local_c88);
    GenerateGetBit_abi_cxx11_(bitIndex);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cf0,"get_has_field_bit_builder",&local_cf1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_cd0);
    std::__cxx11::string::~string(local_cf0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
    std::__cxx11::string::~string(local_cd0);
    GenerateSetBit_abi_cxx11_(bitIndex);
    std::operator+(in_stack_ffffffffffffe688,(char *)in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d58,"set_has_field_bit_message",&local_d59);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_d18);
    std::__cxx11::string::~string(local_d58);
    std::allocator<char>::~allocator((allocator<char> *)&local_d59);
    std::__cxx11::string::~string(local_d18);
    std::__cxx11::string::~string(local_d38);
    GenerateSetBit_abi_cxx11_(bitIndex);
    std::operator+(in_stack_ffffffffffffe688,(char *)in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_dc0,"set_has_field_bit_builder",&local_dc1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_d80);
    std::__cxx11::string::~string(local_dc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
    std::__cxx11::string::~string(local_d80);
    std::__cxx11::string::~string(local_da0);
    GenerateClearBit_abi_cxx11_(iVar7);
    std::operator+(in_stack_ffffffffffffe688,(char *)in_stack_ffffffffffffe680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e28,"clear_has_field_bit_builder",&local_e29);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_de8);
    std::__cxx11::string::~string(local_e28);
    std::allocator<char>::~allocator((allocator<char> *)&local_e29);
    std::__cxx11::string::~string(local_de8);
    std::__cxx11::string::~string(local_e08);
    GenerateGetBit_abi_cxx11_(bitIndex);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e70,"is_field_present_message",&local_e71);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,local_e50);
    std::__cxx11::string::~string(local_e70);
    std::allocator<char>::~allocator((allocator<char> *)&local_e71);
    std::__cxx11::string::~string(local_e50);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e98,"set_has_field_bit_message",&local_e99);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,"");
    std::__cxx11::string::~string(local_e98);
    std::allocator<char>::~allocator((allocator<char> *)&local_e99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ec0,"set_has_field_bit_builder",&local_ec1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,"");
    std::__cxx11::string::~string(local_ec0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ec1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ee8,"clear_has_field_bit_builder",&local_ee9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
    std::__cxx11::string::operator=((string *)pmVar4,"");
    std::__cxx11::string::~string(local_ee8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
    TVar2 = FieldDescriptor::type(in_stack_ffffffffffffe690);
    if (TVar2 == TYPE_BYTES) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f50,"name",&local_f51);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
      std::operator+(in_stack_ffffffffffffe6c8,in_stack_ffffffffffffe6c0);
      bitIndex = (int)((ulong)in_stack_ffffffffffffe6c8 >> 0x20);
      std::operator+(in_stack_ffffffffffffe688,(char *)in_stack_ffffffffffffe680);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f78,"is_field_present_message",&local_f79);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
      std::__cxx11::string::operator=((string *)pmVar4,local_f10);
      std::__cxx11::string::~string(local_f78);
      std::allocator<char>::~allocator((allocator<char> *)&local_f79);
      std::__cxx11::string::~string(local_f10);
      std::__cxx11::string::~string(local_f30);
      std::__cxx11::string::~string(local_f50);
      std::allocator<char>::~allocator((allocator<char> *)&local_f51);
    }
    else {
      std::allocator<char>::allocator();
      bitIndex = (int)((ulong)in_stack_ffffffffffffe6c8 >> 0x20);
      std::__cxx11::string::string(local_fe0,"name",&local_fe1);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
      std::operator+(in_stack_ffffffffffffe6a8,in_stack_ffffffffffffe6a0);
      iVar7 = iStack_24;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1008,"default",&local_1009);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
      std::operator+(in_stack_ffffffffffffe688,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe680);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1030,"is_field_present_message",&local_1031);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
      std::__cxx11::string::operator=((string *)pmVar4,local_fa0);
      std::__cxx11::string::~string(local_1030);
      std::allocator<char>::~allocator((allocator<char> *)&local_1031);
      std::__cxx11::string::~string(local_fa0);
      std::__cxx11::string::~string(local_1008);
      std::allocator<char>::~allocator((allocator<char> *)&local_1009);
      std::__cxx11::string::~string(local_fc0);
      std::__cxx11::string::~string(local_fe0);
      std::allocator<char>::~allocator((allocator<char> *)&local_fe1);
    }
  }
  GenerateGetBit_abi_cxx11_(bitIndex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1078,"get_mutable_bit_builder",&local_1079);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  std::__cxx11::string::operator=((string *)pmVar4,local_1058);
  std::__cxx11::string::~string(local_1078);
  std::allocator<char>::~allocator((allocator<char> *)&local_1079);
  std::__cxx11::string::~string(local_1058);
  GenerateSetBit_abi_cxx11_(bitIndex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10c0,"set_mutable_bit_builder",&local_10c1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  psVar6 = local_10a0;
  std::__cxx11::string::operator=((string *)pmVar4,psVar6);
  std::__cxx11::string::~string(local_10c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10c1);
  std::__cxx11::string::~string(psVar6);
  GenerateClearBit_abi_cxx11_(iVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1108,"clear_mutable_bit_builder",&local_1109);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  std::__cxx11::string::operator=((string *)pmVar4,local_10e8);
  std::__cxx11::string::~string(local_1108);
  std::allocator<char>::~allocator((allocator<char> *)&local_1109);
  std::__cxx11::string::~string(local_10e8);
  GenerateGetBitMutableLocal_abi_cxx11_(bitIndex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1150,"get_mutable_bit_parser",&local_1151);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  psVar6 = local_1130;
  std::__cxx11::string::operator=((string *)pmVar4,psVar6);
  std::__cxx11::string::~string(local_1150);
  std::allocator<char>::~allocator((allocator<char> *)&local_1151);
  std::__cxx11::string::~string(psVar6);
  iVar7 = (int)((ulong)psVar6 >> 0x20);
  GenerateSetBitMutableLocal_abi_cxx11_(iVar7);
  paVar8 = &local_1199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1198,"set_mutable_bit_parser",paVar8);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffe6c0,(key_type *)in_stack_ffffffffffffe6b8);
  psVar6 = local_1178;
  std::__cxx11::string::operator=((string *)pmVar4,psVar6);
  std::__cxx11::string::~string(local_1198);
  std::allocator<char>::~allocator((allocator<char> *)&local_1199);
  std::__cxx11::string::~string(psVar6);
  GenerateGetBitFromLocal_abi_cxx11_(iVar7);
  __k = (key_type *)local_11e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_11e1 + 1),"get_has_field_bit_from_local",(allocator *)__k);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pmVar4,__k);
  psVar6 = local_11c0;
  std::__cxx11::string::operator=((string *)pmVar5,psVar6);
  std::__cxx11::string::~string((string *)(local_11e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_11e1);
  std::__cxx11::string::~string(psVar6);
  GenerateSetBitToLocal_abi_cxx11_(iVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1228,"set_has_field_bit_to_local",&local_1229);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pmVar4,__k);
  std::__cxx11::string::operator=((string *)pmVar4,local_1208);
  std::__cxx11::string::~string(local_1228);
  std::allocator<char>::~allocator((allocator<char> *)&local_1229);
  std::__cxx11::string::~string(local_1208);
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           int messageBitIndex, int builderBitIndex,
                           const FieldGeneratorInfo* info,
                           ClassNameResolver* name_resolver,
                           std::map<std::string, std::string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);

  (*variables)["empty_list"] = "com.google.protobuf.LazyStringArrayList.EMPTY";

  (*variables)["default"] = ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["default_init"] =
      "= " + ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["capitalized_type"] = "String";
  (*variables)["tag"] =
      StrCat(static_cast<int32>(WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = StrCat(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  (*variables)["null_check"] =
      "  if (value == null) {\n"
      "    throw new NullPointerException();\n"
      "  }\n";
  (*variables)["writeString"] = "com.google.protobuf.GeneratedMessage" +
                                GeneratedCodeVersionSuffix() + ".writeString";
  (*variables)["computeStringSize"] = "com.google.protobuf.GeneratedMessage" +
                                      GeneratedCodeVersionSuffix() +
                                      ".computeStringSize";

  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  (*variables)["on_changed"] = "onChanged();";

  if (SupportFieldPresence(descriptor->file())) {
    // For singular messages and builders, one bit is used for the hasField bit.
    (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);
    (*variables)["get_has_field_bit_builder"] = GenerateGetBit(builderBitIndex);

    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        GenerateSetBit(messageBitIndex) + ";";
    (*variables)["set_has_field_bit_builder"] =
        GenerateSetBit(builderBitIndex) + ";";
    (*variables)["clear_has_field_bit_builder"] =
        GenerateClearBit(builderBitIndex) + ";";

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["set_has_field_bit_builder"] = "";
    (*variables)["clear_has_field_bit_builder"] = "";

    (*variables)["is_field_present_message"] =
        "!get" + (*variables)["capitalized_name"] + "Bytes().isEmpty()";
  }

  // For repeated builders, one bit is used for whether the array is immutable.
  (*variables)["get_mutable_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_mutable_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_mutable_bit_builder"] = GenerateClearBit(builderBitIndex);

  // For repeated fields, one bit is used for whether the array is immutable
  // in the parsing constructor.
  (*variables)["get_mutable_bit_parser"] =
      GenerateGetBitMutableLocal(builderBitIndex);
  (*variables)["set_mutable_bit_parser"] =
      GenerateSetBitMutableLocal(builderBitIndex);

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);
}